

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator.cpp
# Opt level: O0

int main(void)

{
  bool bVar1;
  Node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *this;
  Node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *this_00;
  Node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *pNVar2;
  Node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *pNVar3;
  Node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  ostream *this_02;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *member;
  iterator __end1;
  iterator __begin1;
  BinaryTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *__range1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  undefined1 local_112;
  allocator<char> local_111;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  allocator<char> local_e9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  undefined1 local_c3;
  undefined1 local_c2;
  allocator<char> local_c1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  undefined1 local_9a;
  allocator<char> local_99;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  allocator<char> local_71;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  allocator<char> local_39;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  BinaryTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_18;
  BinaryTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  family;
  
  family.root._4_4_ = 0;
  this = (Node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
         operator_new(0x40);
  __range1._4_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"me",&local_39);
  this_00 = (Node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)operator_new(0x40);
  local_c3 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"mother",&local_71);
  pNVar2 = (Node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
           )operator_new(0x40);
  local_9a = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"mother\'s mother",&local_99);
  Node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Node
            (pNVar2,&local_98,(pointer)0x0,(pointer)0x0);
  local_9a = 0;
  pNVar3 = (Node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
           )operator_new(0x40);
  local_c2 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,"mother\'s father",&local_c1);
  Node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Node
            (pNVar3,&local_c0,(pointer)0x0,(pointer)0x0);
  local_c2 = 0;
  Node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Node
            (this_00,&local_70,pNVar2,pNVar3);
  local_c3 = 0;
  pNVar2 = (Node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
           )operator_new(0x40);
  __range1._5_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,"father",&local_e9);
  pNVar3 = (Node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
           )operator_new(0x40);
  local_112 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_110,"father\'s mother",&local_111);
  Node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Node
            (pNVar3,&local_110,(pointer)0x0,(pointer)0x0);
  local_112 = 0;
  this_01 = (Node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)operator_new(0x40);
  __range1._6_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_138,"father\'s father",(allocator<char> *)((long)&__range1 + 7));
  Node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Node
            (this_01,&local_138,(pointer)0x0,(pointer)0x0);
  __range1._6_1_ = 0;
  Node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Node
            (pNVar2,&local_e8,pNVar3,this_01);
  __range1._5_1_ = 0;
  Node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Node
            (this,&local_38,this_00,pNVar2);
  __range1._4_1_ = 0;
  BinaryTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  BinaryTree(&local_18,this);
  std::__cxx11::string::~string((string *)&local_138);
  std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 7));
  std::__cxx11::string::~string((string *)&local_110);
  std::allocator<char>::~allocator(&local_111);
  std::__cxx11::string::~string((string *)&local_e8);
  std::allocator<char>::~allocator(&local_e9);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator(&local_c1);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator(&local_99);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  __end1 = BinaryTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::begin(&local_18);
  member = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           BinaryTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::end(&local_18);
  while( true ) {
    bVar1 = BinaryTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::
            BinaryTreeIterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator!=(&__end1,(BinaryTreeIterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&member);
    if (!bVar1) break;
    pbVar4 = BinaryTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::
             BinaryTreeIterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&__end1);
    this_02 = std::operator<<((ostream *)&std::cout,(string *)pbVar4);
    std::ostream::operator<<(this_02,std::endl<char,std::char_traits<char>>);
    BinaryTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    BinaryTreeIterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end1);
  }
  family.root._4_4_ = 0;
  BinaryTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~BinaryTree(&local_18);
  return family.root._4_4_;
}

Assistant:

int main()
{
	BinaryTree<std::string> family{
		new Node<std::string>{"me",
			new Node<std::string>{"mother",
				new Node<std::string>{"mother's mother"},
				new Node<std::string>{"mother's father"}
			},
			new Node<std::string>{"father",
				new Node<std::string>{"father's mother"},
				new Node<std::string>{"father's father"}
			}
		}
	};


	for(const auto& member : family)
	{
		std::cout << member << std::endl;
	}

	return 0;
}